

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

FaceData * __thiscall
Ptex::v2_2::PtexReader::getFace(PtexReader *this,int levelid,Level *level,int faceid,Res res)

{
  pointer ppFVar1;
  FaceData *pFVar2;
  
  ppFVar1 = (level->faces).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = ppFVar1[faceid];
  if (pFVar2 == (FaceData *)0x0) {
    readFace(this,levelid,level,faceid,res);
    pFVar2 = ppFVar1[faceid];
  }
  return pFVar2;
}

Assistant:

FaceData* getFace(int levelid, Level* level, int faceid, Res res)
    {
        FaceData*& face = level->faces[faceid];
        if (!face) readFace(levelid, level, faceid, res);
        return face;
    }